

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O3

bool __thiscall
QItemSelectionRange::intersects(QItemSelectionRange *this,QItemSelectionRange *other)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QAbstractItemModel *pQVar4;
  QAbstractItemModel *pQVar5;
  long in_FS_OFFSET;
  QModelIndex local_60;
  QModelIndex local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = QPersistentModelIndex::model(&this->tl);
  pQVar5 = QPersistentModelIndex::model(&other->tl);
  if (pQVar4 == pQVar5) {
    iVar2 = QPersistentModelIndex::row(&this->tl);
    iVar3 = QPersistentModelIndex::row(&other->br);
    if (iVar2 <= iVar3) {
      iVar2 = QPersistentModelIndex::row(&this->br);
      iVar3 = QPersistentModelIndex::row(&other->tl);
      if (iVar3 <= iVar2) {
        iVar2 = QPersistentModelIndex::column(&this->tl);
        iVar3 = QPersistentModelIndex::column(&other->br);
        if (iVar2 <= iVar3) {
          iVar2 = QPersistentModelIndex::column(&this->br);
          iVar3 = QPersistentModelIndex::column(&other->tl);
          if (iVar3 <= iVar2) {
            QPersistentModelIndex::parent(&local_48,&this->tl);
            QPersistentModelIndex::parent(&local_60,&other->tl);
            if ((((local_48.r == local_60.r) && (local_48.c == local_60.c)) &&
                (local_48.i == local_60.i)) && (local_48.m.ptr == local_60.m.ptr)) {
              bVar1 = isValid(this);
              if (bVar1) {
                bVar1 = isValid(other);
                goto LAB_00458afa;
              }
            }
          }
        }
      }
    }
  }
  bVar1 = false;
LAB_00458afa:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QItemSelectionRange::intersects(const QItemSelectionRange &other) const
{
    // isValid() and parent() last since they are more expensive
    if (model() != other.model())
        return false;

    if (top() > other.bottom() || bottom() < other.top())
        return false;

    if (left() > other.right() || right() < other.left())
        return false;

    if (parent() != other.parent())
        return false;

    return isValid() && other.isValid();
}